

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

GLMClassifier * __thiscall CoreML::Specification::Model::mutable_glmclassifier(Model *this)

{
  GLMClassifier *this_00;
  
  if (this->_oneof_case_[0] == 400) {
    this_00 = (GLMClassifier *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 400;
    this_00 = (GLMClassifier *)operator_new(0x58);
    GLMClassifier::GLMClassifier(this_00);
    (this->Type_).glmclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::GLMClassifier* Model::mutable_glmclassifier() {
  if (!has_glmclassifier()) {
    clear_Type();
    set_has_glmclassifier();
    Type_.glmclassifier_ = new ::CoreML::Specification::GLMClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.glmClassifier)
  return Type_.glmclassifier_;
}